

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O1

void __thiscall LexicalAnalyzer::RemoveComment(LexicalAnalyzer *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  iterator iter;
  char *pcVar8;
  iterator __position;
  undefined8 uStack_70;
  LexicalAnalyzer *pLStack_68;
  ulong uStack_60;
  long lStack_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_50;
  char *pcStack_48;
  code *pcStack_40;
  
  this_00 = &this->lines;
  __position._M_current =
       (this->lines).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != __position._M_current) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pcVar8 = (char *)((long)&((__position._M_current)->_M_dataplus)._M_p + lVar7);
      pcStack_40 = (code *)0x106b8f;
      lVar2 = std::__cxx11::string::find(pcVar8,0x126150,0);
      if (lVar2 << 0x20 != -0x100000000) {
        uVar3 = (lVar2 << 0x20) >> 0x20;
        pbVar1 = (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(ulong *)((long)&pbVar1->_M_string_length + lVar7) < uVar3) {
          pcVar5 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
          pcStack_40 = PrintLines;
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar3);
          uStack_70 = *(long *)(pcVar5 + 0x28);
          if (uStack_70 != *(long *)(pcVar5 + 0x20)) {
            pcStack_40 = (code *)0xffffffff00000000;
            lVar2 = 8;
            uVar3 = 0;
            pLStack_68 = this;
            uStack_60 = uVar6;
            lStack_58 = lVar7;
            pvStack_50 = this_00;
            pcStack_48 = pcVar8;
            do {
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3);
              uStack_70 = CONCAT17(9,(undefined7)uStack_70);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,(char *)((long)&uStack_70 + 7),1);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,*(char **)(*(long *)(pcVar5 + 0x20) + -8 + lVar2),
                                  *(long *)(*(long *)(pcVar5 + 0x20) + lVar2));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              uVar3 = uVar3 + 1;
              lVar2 = lVar2 + 0x20;
            } while (uVar3 < (ulong)(*(long *)(pcVar5 + 0x28) - *(long *)(pcVar5 + 0x20) >> 5));
          }
          return;
        }
        *(ulong *)((long)&pbVar1->_M_string_length + lVar7) = uVar3;
        *(undefined1 *)(*(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7) + uVar3) = 0;
      }
      uVar6 = uVar6 + 1;
      __position._M_current =
           (this->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (uVar6 < (ulong)((long)(this->lines).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)__position._M_current >> 5));
  }
  while (__position._M_current !=
         (this->lines).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    if ((__position._M_current)->_M_string_length == 0) {
      pcStack_40 = (code *)0x106beb;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,__position);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void LexicalAnalyzer::RemoveComment() {
    for (int i = 0; i < lines.size(); i++) {
        //std::cout<<lines[i]<<std::endl;
        int pos = lines[i].find("//");//double //
        if (pos != std::string::npos) {//Find double //
            lines[i].erase(pos);//Erase [pos,]
        }
    }
    // erase empty string in lines
    for (std::vector<std::string>::iterator iter = lines.begin(); iter != lines.end();) {
        if (iter->empty()) {
            lines.erase(iter);
        } else
            iter++;
    }
}